

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O0

void __thiscall OIDCallback::OIDCallback(OIDCallback *this,SortableOIDType *oid,string *value)

{
  string *value_local;
  SortableOIDType *oid_local;
  OIDCallback *this_local;
  
  ValueCallback::ValueCallback(&this->super_ValueCallback,oid,OID);
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_0028fb08;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

OIDCallback(SortableOIDType* oid, const std::string &value): ValueCallback(oid, ASN_TYPE::OID), value(value) {}